

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# burstsort_mkq.cpp
# Opt level: O2

TSTNode<unsigned_char> * __thiscall
BurstSimple<unsigned_char>::operator()
          (BurstSimple<unsigned_char> *this,
          vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *bucket,uchar *oracle,
          size_t param_3)

{
  pointer ppuVar1;
  byte bVar2;
  TSTNode<unsigned_char> *this_00;
  vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *pvVar3;
  vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *pvVar4;
  vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *pvVar5;
  vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *this_01;
  uint uVar6;
  ulong uVar7;
  
  this_00 = (TSTNode<unsigned_char> *)operator_new(0x28);
  TSTNode<unsigned_char>::TSTNode(this_00);
  pvVar3 = (vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *)operator_new(0x18);
  (pvVar3->super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pvVar3->super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pvVar3->super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pvVar4 = (vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *)operator_new(0x18);
  (pvVar4->super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pvVar4->super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pvVar4->super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pvVar5 = (vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *)operator_new(0x18);
  (pvVar5->super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pvVar5->super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pvVar5->super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar2 = pseudo_median<unsigned_char>
                    (oracle,oracle + ((long)(bucket->
                                            super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>
                                            )._M_impl.super__Vector_impl_data._M_finish -
                                      (long)(bucket->
                                            super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>
                                            )._M_impl.super__Vector_impl_data._M_start >> 3));
  uVar6 = 0;
  while( true ) {
    uVar7 = (ulong)uVar6;
    ppuVar1 = (bucket->super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>).
              _M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(bucket->super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)ppuVar1 >> 3) <= uVar7)
    break;
    this_01 = pvVar3;
    if ((bVar2 <= oracle[uVar7]) && (this_01 = pvVar5, oracle[uVar7] == bVar2)) {
      this_01 = pvVar4;
    }
    std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>::push_back
              (this_01,ppuVar1 + uVar7);
    uVar6 = uVar6 + 1;
  }
  this_00->pivot = bVar2;
  (this_00->buckets)._M_elems[0] = pvVar3;
  (this_00->buckets)._M_elems[1] = pvVar4;
  (this_00->buckets)._M_elems[2] = pvVar5;
  return this_00;
}

Assistant:

TSTNode<CharT>*
	operator()(const BucketT& bucket, CharT* oracle, size_t /*depth*/) const
	{
		TSTNode<CharT>* new_node = new TSTNode<CharT>;
		BucketT* bucket0 = new BucketT;
		BucketT* bucket1 = new BucketT;
		BucketT* bucket2 = new BucketT;
		CharT pivot = pseudo_median(oracle, oracle+bucket.size());
		for (unsigned i=0; i < bucket.size(); ++i) {
			if (oracle[i] < pivot) {
				bucket0->push_back(bucket[i]);
			} else if (oracle[i] == pivot) {
				bucket1->push_back(bucket[i]);
			} else {
				bucket2->push_back(bucket[i]);
			}
		}
		new_node->pivot = pivot;
		new_node->buckets[0] = bucket0;
		new_node->buckets[1] = bucket1;
		new_node->buckets[2] = bucket2;
		debug() << "BurstSimple() pivot=" << pivot
			<< " [0]=" << bucket0->size()
			<< " [1]=" << bucket1->size()
			<< " [2]=" << bucket2->size()
			<< "\n";
		return new_node;
	}